

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Fixed * ft_var_readpackeddeltas(FT_Stream stream,FT_ULong size,FT_UInt delta_cnt)

{
  FT_Memory memory;
  byte bVar1;
  FT_Byte FVar2;
  FT_UInt16 FVar3;
  int iVar4;
  FT_Fixed *P;
  byte bVar5;
  long lVar6;
  uint uVar7;
  ulong new_count;
  ulong uVar8;
  ulong uVar9;
  ulong local_68;
  FT_Error error;
  
  memory = stream->memory;
  new_count = (ulong)delta_cnt;
  uVar8 = 0;
  P = (FT_Fixed *)ft_mem_qrealloc(memory,8,0,new_count,(void *)0x0,&error);
  if (error == 0) {
    local_68 = 0;
    do {
      if ((delta_cnt <= (uint)uVar8) || (size <= local_68)) {
        if (delta_cnt <= (uint)uVar8) {
          return P;
        }
        break;
      }
      bVar1 = FT_Stream_GetByte(stream);
      bVar5 = bVar1 & 0x3f;
      uVar9 = uVar8 & 0xffffffff;
      uVar7 = (uint)bVar5;
      iVar4 = (int)local_68;
      if ((char)bVar1 < '\0') {
        local_68 = (ulong)(iVar4 + 1);
        for (lVar6 = 0; (uVar8 = uVar9 + lVar6, (uint)lVar6 <= uVar7 && (uVar8 < new_count));
            lVar6 = lVar6 + 1) {
          P[uVar9 + lVar6] = 0;
        }
      }
      else if (bVar1 < 0x40) {
        local_68 = (ulong)(iVar4 + (uint)bVar5 + 2);
        if (size < local_68) break;
        for (lVar6 = 0;
            (uVar8 = uVar9 + lVar6, (uint)lVar6 < (uint)bVar5 || (uint)lVar6 == uVar7 &&
            (uVar8 < new_count)); lVar6 = lVar6 + 1) {
          FVar2 = FT_Stream_GetByte(stream);
          P[uVar9 + lVar6] = (long)(char)FVar2 << 0x10;
        }
      }
      else {
        local_68 = (ulong)(iVar4 + (uint)bVar5 * 2 + 3);
        if (size < local_68) break;
        for (lVar6 = 0; (uVar8 = uVar9 + lVar6, (uint)lVar6 <= uVar7 && (uVar8 < new_count));
            lVar6 = lVar6 + 1) {
          FVar3 = FT_Stream_GetUShort(stream);
          P[uVar9 + lVar6] = (long)(short)FVar3 << 0x10;
        }
      }
    } while (uVar7 < (uint)lVar6);
    ft_mem_free(memory,P);
  }
  return (FT_Fixed *)0x0;
}

Assistant:

static FT_Fixed*
  ft_var_readpackeddeltas( FT_Stream  stream,
                           FT_ULong   size,
                           FT_UInt    delta_cnt )
  {
    FT_Fixed  *deltas = NULL;
    FT_UInt    runcnt, cnt;
    FT_UInt    i, j;
    FT_UInt    bytes_used;
    FT_Memory  memory = stream->memory;
    FT_Error   error;


    if ( FT_QNEW_ARRAY( deltas, delta_cnt ) )
      return NULL;

    i          = 0;
    bytes_used = 0;

    while ( i < delta_cnt && bytes_used < size )
    {
      runcnt = FT_GET_BYTE();
      cnt    = runcnt & GX_DT_DELTA_RUN_COUNT_MASK;

      bytes_used++;

      if ( runcnt & GX_DT_DELTAS_ARE_ZERO )
      {
        /* `cnt` + 1 zeroes get added */
        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = 0;
      }
      else if ( runcnt & GX_DT_DELTAS_ARE_WORDS )
      {
        /* `cnt` + 1 shorts from the stack */
        bytes_used += 2 * ( cnt + 1 );
        if ( bytes_used > size )
        {
          FT_TRACE1(( "ft_var_readpackeddeltas:"
                      " number of short deltas too large\n" ));
          goto Fail;
        }

        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = FT_intToFixed( FT_GET_SHORT() );
      }
      else
      {
        /* `cnt` + 1 signed bytes from the stack */
        bytes_used += cnt + 1;
        if ( bytes_used > size )
        {
          FT_TRACE1(( "ft_var_readpackeddeltas:"
                      " number of byte deltas too large\n" ));
          goto Fail;
        }

        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = FT_intToFixed( FT_GET_CHAR() );
      }

      if ( j <= cnt )
      {
        FT_TRACE1(( "ft_var_readpackeddeltas:"
                    " number of deltas too large\n" ));
        goto Fail;
      }
    }

    if ( i < delta_cnt )
    {
      FT_TRACE1(( "ft_var_readpackeddeltas: not enough deltas\n" ));
      goto Fail;
    }

    return deltas;

  Fail:
    FT_FREE( deltas );
    return NULL;
  }